

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

int double_conversion::CompareBufferWithDiyFp(Vector<const_char> buffer,int exponent,DiyFp diy_fp)

{
  int32_t iVar1;
  int iVar2;
  int in_EDX;
  undefined4 in_ESI;
  Bignum *in_RDI;
  Bignum diy_fp_bignum;
  Bignum buffer_bignum;
  int in_stack_fffffffffffffbbc;
  Bignum *this;
  uint64_t value;
  Bignum *in_stack_fffffffffffffbd0;
  Bignum *in_stack_fffffffffffffbd8;
  Bignum *in_stack_fffffffffffffbf0;
  Vector<const_char> in_stack_fffffffffffffbf8;
  Bignum local_228;
  int local_24;
  DiyFp local_20;
  Bignum *local_10;
  undefined4 local_8;
  undefined4 uStack_4;
  
  local_24 = in_EDX;
  local_10 = in_RDI;
  local_8 = in_ESI;
  Bignum::Bignum(&local_228);
  Bignum::Bignum((Bignum *)&stack0xfffffffffffffbd4);
  value = CONCAT44(uStack_4,local_8);
  Bignum::AssignDecimalString(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8);
  DiyFp::f(&local_20);
  Bignum::AssignUInt64(in_stack_fffffffffffffbd0,value);
  if (local_24 < 0) {
    Bignum::MultiplyByPowerOfTen(local_10,in_stack_fffffffffffffbbc);
    this = local_10;
  }
  else {
    Bignum::MultiplyByPowerOfTen(local_10,in_stack_fffffffffffffbbc);
    this = local_10;
  }
  iVar1 = DiyFp::e(&local_20);
  if (iVar1 < 1) {
    DiyFp::e(&local_20);
    Bignum::ShiftLeft(this,in_stack_fffffffffffffbbc);
  }
  else {
    DiyFp::e(&local_20);
    Bignum::ShiftLeft(this,in_stack_fffffffffffffbbc);
  }
  iVar2 = Bignum::Compare(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  return iVar2;
}

Assistant:

static int CompareBufferWithDiyFp(Vector<const char> buffer,
                                  int exponent,
                                  DiyFp diy_fp) {
  DOUBLE_CONVERSION_ASSERT(buffer.length() + exponent <= kMaxDecimalPower + 1);
  DOUBLE_CONVERSION_ASSERT(buffer.length() + exponent > kMinDecimalPower);
  DOUBLE_CONVERSION_ASSERT(buffer.length() <= kMaxSignificantDecimalDigits);
  // Make sure that the Bignum will be able to hold all our numbers.
  // Our Bignum implementation has a separate field for exponents. Shifts will
  // consume at most one bigit (< 64 bits).
  // ln(10) == 3.3219...
  DOUBLE_CONVERSION_ASSERT(((kMaxDecimalPower + 1) * 333 / 100) < Bignum::kMaxSignificantBits);
  Bignum buffer_bignum;
  Bignum diy_fp_bignum;
  buffer_bignum.AssignDecimalString(buffer);
  diy_fp_bignum.AssignUInt64(diy_fp.f());
  if (exponent >= 0) {
    buffer_bignum.MultiplyByPowerOfTen(exponent);
  } else {
    diy_fp_bignum.MultiplyByPowerOfTen(-exponent);
  }
  if (diy_fp.e() > 0) {
    diy_fp_bignum.ShiftLeft(diy_fp.e());
  } else {
    buffer_bignum.ShiftLeft(-diy_fp.e());
  }
  return Bignum::Compare(buffer_bignum, diy_fp_bignum);
}